

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobian
          (KinDynComputations *this,FrameIndex frameIndex,MatrixDynSize *outJacobian)

{
  bool bVar1;
  MatrixView<double> *in_stack_00000558;
  FrameIndex in_stack_00000560;
  KinDynComputations *in_stack_00000568;
  uint in_stack_ffffffffffffffb0;
  MatrixDynSize *in_stack_ffffffffffffffb8;
  MatrixView<double> *in_stack_ffffffffffffffc0;
  
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (MatrixStorageOrdering *)(ulong)in_stack_ffffffffffffffb0);
  bVar1 = getFrameFreeFloatingJacobian(in_stack_00000568,in_stack_00000560,in_stack_00000558);
  return bVar1;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobian(const FrameIndex frameIndex,
                                                      MatrixDynSize& outJacobian)
{
    return getFrameFreeFloatingJacobian(frameIndex, MatrixView<double>(outJacobian));
}